

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string *psVar4;
  long lVar5;
  char *pcVar6;
  cmMakeSafe local_2a0;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  cmMakeSafe local_200;
  cmMakeSafe local_1f8;
  string local_1f0;
  string local_1d0;
  reference local_1b0;
  string *depend;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string binDir;
  cmMakeSafe local_168;
  allocator<char> local_159;
  string local_158;
  char *local_138;
  char *sym;
  char *space;
  undefined1 local_108 [8];
  string tgt;
  string local_c8 [32];
  long local_a8;
  size_type rpos;
  size_type lpos;
  string replace;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string err;
  bool in_help_local;
  bool symbolic_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  string *target_local;
  char *comment_local;
  ostream *os_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  err.field_2._M_local_buf[0xf] = symbolic;
  err.field_2._M_local_buf[0xe] = in_help;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&lpos);
    if (comment != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&lpos,comment);
      rpos = 0;
      while (local_a8 = std::__cxx11::string::find((char)&lpos,10), local_a8 != -1) {
        poVar3 = std::operator<<(os,"# ");
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&lpos);
        poVar3 = std::operator<<(poVar3,local_c8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string(local_c8);
        rpos = local_a8 + 1;
      }
      poVar3 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)((long)&tgt.field_2 + 8),(ulong)&lpos);
      poVar3 = std::operator<<(poVar3,(string *)(tgt.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)(tgt.field_2._M_local_buf + 8));
    }
    psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)&space,(cmLocalGenerator *)this,psVar4,target);
    cmSystemTools::ConvertToOutputPath((string *)local_108,(string *)&space);
    std::__cxx11::string::~string((string *)&space);
    sym = "";
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 1) {
      sym = " ";
    }
    if ((err.field_2._M_local_buf[0xf] & 1U) != 0) {
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"CMAKE_MAKE_SYMBOLIC_RULE",&local_159);
      pcVar6 = cmMakefile::GetDefinition(this_00,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      local_138 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        cmMakeSafe::cmMakeSafe(&local_168,(string *)local_108);
        poVar3 = ::operator<<(os,&local_168);
        poVar3 = std::operator<<(poVar3,sym);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,local_138);
        std::operator<<(poVar3,"\n");
      }
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(depends);
    if (bVar1) {
      cmMakeSafe::cmMakeSafe((cmMakeSafe *)((long)&binDir.field_2 + 8),(string *)local_108);
      poVar3 = ::operator<<(os,(cmMakeSafe *)((long)&binDir.field_2 + 8));
      poVar3 = std::operator<<(poVar3,sym);
      std::operator<<(poVar3,":\n");
    }
    else {
      psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      std::__cxx11::string::string((string *)&__range2,(string *)psVar4);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(depends);
      depend = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(depends);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&depend), bVar1) {
        local_1b0 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        std::__cxx11::string::operator=((string *)&lpos,(string *)local_1b0);
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_1f0,(cmLocalGenerator *)this,(string *)&__range2,(string *)&lpos);
        cmSystemTools::ConvertToOutputPath(&local_1d0,&local_1f0);
        std::__cxx11::string::operator=((string *)&lpos,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        cmMakeSafe::cmMakeSafe(&local_1f8,(string *)local_108);
        poVar3 = ::operator<<(os,&local_1f8);
        poVar3 = std::operator<<(poVar3,sym);
        poVar3 = std::operator<<(poVar3,": ");
        cmMakeSafe::cmMakeSafe(&local_200,(string *)&lpos);
        poVar3 = ::operator<<(poVar3,&local_200);
        std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::string::~string((string *)&__range2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"\t",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"\n",&local_291);
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_220,&local_240,commands,&local_268,&local_290);
    poVar3 = std::operator<<(os,(string *)&local_220);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    if (((err.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this), !bVar1)) {
      poVar3 = std::operator<<(os,".PHONY : ");
      cmMakeSafe::cmMakeSafe(&local_2a0,(string *)local_108);
      poVar3 = ::operator<<(poVar3,&local_2a0);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(os,"\n");
    if ((err.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LocalHelp,target);
    }
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&lpos);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"No target for WriteMakeRule! called with comment: ",&local_61);
    std::allocator<char>::~allocator(&local_61);
    if (comment != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)local_60,comment);
    }
    cmSystemTools::Error((string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    std::string err("No target for WriteMakeRule! called with comment: ");
    if (comment) {
      err += comment;
    }
    cmSystemTools::Error(err);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt = cmSystemTools::ConvertToOutputPath(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), target));

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (const char* sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << cmMakeSafe(tgt) << space << ": " << sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << cmMakeSafe(tgt) << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    std::string binDir = this->GetBinaryDirectory();
    for (std::string const& depend : depends) {
      replace = depend;
      replace = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, replace));
      os << cmMakeSafe(tgt) << space << ": " << cmMakeSafe(replace) << "\n";
    }
  }

  // Write the list of commands.
  os << cmWrap("\t", commands, "", "\n") << "\n";
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << cmMakeSafe(tgt) << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}